

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  int iVar1;
  ARKodeSplittingStepMem step_mem;
  ARKodeSplittingStepMem local_18;
  
  local_18 = (ARKodeSplittingStepMem)0x0;
  iVar1 = splittingStep_AccessStepMem(ark_mem,"splittingStep_WriteParameters",&local_18);
  if (iVar1 == 0) {
    fprintf((FILE *)fp,"SplittingStep time step module parameters:\n  Method order %i\n\n",
            (ulong)(uint)local_18->order);
  }
  return iVar1;
}

Assistant:

static int splittingStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  fprintf(fp, "SplittingStep time step module parameters:\n  Method order %i\n\n",
          step_mem->order);

  return ARK_SUCCESS;
}